

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_stream_socket.hpp
# Opt level: O1

void __thiscall
asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_receive::operator()
          (initiate_async_receive *this,
          function<void_(const_std::error_code_&,_unsigned_long)> *handler,
          mutable_buffers_1 *buffers,message_flags flags)

{
  long *plVar1;
  non_const_lvalue<std::function<void_(const_std::error_code_&,_unsigned_long)>_&> handler2;
  _Any_data local_40;
  _Manager_type local_30;
  
  std::function<void_(const_std::error_code_&,_unsigned_long)>::function
            ((function<void_(const_std::error_code_&,_unsigned_long)> *)&local_40,handler);
  plVar1 = *(long **)this;
  detail::reactive_socket_service_base::
  async_receive<asio::mutable_buffers_1,std::function<void(std::error_code_const&,unsigned_long)>,asio::any_io_executor>
            ((reactive_socket_service_base *)(*plVar1 + 0x28),
             (base_implementation_type *)(plVar1 + 1),buffers,flags,
             (function<void_(const_std::error_code_&,_unsigned_long)> *)&local_40,
             (any_io_executor *)(plVar1 + 4));
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void operator()(ReadHandler&& handler,
        const MutableBufferSequence& buffers,
        socket_base::message_flags flags) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ReadHandler.
      ASIO_READ_HANDLER_CHECK(ReadHandler, handler) type_check;

      detail::non_const_lvalue<ReadHandler> handler2(handler);
      self_->impl_.get_service().async_receive(
          self_->impl_.get_implementation(), buffers, flags,
          handler2.value, self_->impl_.get_executor());
    }